

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

bool __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
is_before_in_totally_ordered_filtration::operator()
          (is_before_in_totally_ordered_filtration *this,Simplex_handle *sh1,Simplex_handle *sh2)

{
  node_ptr pcVar1;
  node_ptr pcVar2;
  bool bVar3;
  Simplex_handle local_10;
  Simplex_handle local_8;
  
  local_8 = (Simplex_handle)(sh1->m_iit).members_.nodeptr_;
  if ((local_8.m_iit.members_.nodeptr_ !=
       (iiterator_members<boost::intrusive::compact_rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>_*,_false>
        )0x0) &&
     (local_10 = (Simplex_handle)(sh2->m_iit).members_.nodeptr_,
     local_10.m_iit.members_.nodeptr_ !=
     (iiterator_members<boost::intrusive::compact_rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>_*,_false>
      )0x0)) {
    pcVar1 = *(node_ptr *)((long)local_8.m_iit.members_.nodeptr_ + 0x20);
    pcVar2 = *(node_ptr *)((long)local_10.m_iit.members_.nodeptr_ + 0x20);
    if (((double)pcVar1 != (double)pcVar2) || (NAN((double)pcVar1) || NAN((double)pcVar2))) {
      bVar3 = (double)pcVar1 < (double)pcVar2;
    }
    else {
      bVar3 = reverse_lexicographic_order(this->st_,&local_8,&local_10);
    }
    return bVar3;
  }
  __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                "static pointer boost::intrusive::bhtraits_base<boost::container::dtl::tree_node<std::pair<const int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>>>, void *, boost::container::red_black_tree, true>, boost::intrusive::compact_rbtree_node<void *> *, boost::intrusive::dft_tag, 3>::to_value_ptr(const node_ptr &) [T = boost::container::dtl::tree_node<std::pair<const int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>>>, void *, boost::container::red_black_tree, true>, NodePtr = boost::intrusive::compact_rbtree_node<void *> *, Tag = boost::intrusive::dft_tag, Type = 3]"
               );
}

Assistant:

bool operator()(const Simplex_handle sh1, const Simplex_handle sh2) const {
      // Not using st_->filtration(sh1) because it uselessly tests for null_simplex.
      if (!(sh1->second.filtration() == sh2->second.filtration())) {
        return sh1->second.filtration() < sh2->second.filtration();
      }
      // is sh1 a proper subface of sh2
      return st_->reverse_lexicographic_order(sh1, sh2);
    }